

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

VkPipelineLibraryCreateInfoKHR *
find_pnext<VkPipelineLibraryCreateInfoKHR>(VkStructureType type,void *pNext)

{
  VkPipelineLibraryCreateInfoKHR *pVVar1;
  undefined4 in_register_0000003c;
  
  for (pVVar1 = (VkPipelineLibraryCreateInfoKHR *)CONCAT44(in_register_0000003c,type);
      (pVVar1 != (VkPipelineLibraryCreateInfoKHR *)0x0 &&
      (pVVar1->sType != VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR));
      pVVar1 = (VkPipelineLibraryCreateInfoKHR *)pVVar1->pNext) {
  }
  return pVVar1;
}

Assistant:

static inline const T *find_pnext(VkStructureType type, const void *pNext)
{
	while (pNext != nullptr)
	{
		auto *sin = static_cast<const VkBaseInStructure *>(pNext);
		if (sin->sType == type)
			return static_cast<const T*>(pNext);

		pNext = sin->pNext;
	}

	return nullptr;
}